

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

ostream * tcu::operator<<(ostream *str,ChannelOrder order)

{
  char **ppcVar1;
  ostream *poVar2;
  char *local_c8;
  char *orderStrings [21];
  ChannelOrder order_local;
  ostream *str_local;
  
  memcpy(&local_c8,&DAT_00cc0ba0,0xa8);
  ppcVar1 = de::getSizedArrayElement<21,21,char_const*>((char *(*) [21])&local_c8,order);
  poVar2 = std::operator<<(str,*ppcVar1);
  return poVar2;
}

Assistant:

std::ostream& operator<< (std::ostream& str, TextureFormat::ChannelOrder order)
{
	const char* const orderStrings[] =
	{
		"R",
		"A",
		"I",
		"L",
		"LA",
		"RG",
		"RA",
		"RGB",
		"RGBA",
		"ARGB",
		"BGR",
		"BGRA",

		"sR",
		"sRG",
		"sRGB",
		"sRGBA",
		"sBGR",
		"sBGRA",

		"D",
		"S",
		"DS"
	};

	return str << de::getSizedArrayElement<TextureFormat::CHANNELORDER_LAST>(orderStrings, order);
}